

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
deqp::egl::anon_unknown_0::getDamageRegion
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Frame *frame,int marginLeft,
          int marginBottom,int marginRight,int marginTop)

{
  vector<int,_std::allocator<int>_> *in_RAX;
  int *piVar1;
  pointer pDVar2;
  iterator iVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  long lVar5;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar2 = (frame->draws).
           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((frame->draws).
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar2) {
    local_3c = marginTop + marginBottom;
    lVar5 = 4;
    pvVar4 = (vector<int,_std::allocator<int>_> *)0x0;
    local_38 = marginBottom;
    local_34 = marginLeft;
    do {
      local_40 = *(int *)((long)(pDVar2->rect).bottomLeft.m_data + lVar5 + -4) - local_34;
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (iVar3._M_current == piVar1) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar3,&local_40);
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar3._M_current = local_40;
        iVar3._M_current = iVar3._M_current + 1;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current;
      }
      local_40 = *(int *)((long)(pDVar2->rect).bottomLeft.m_data + lVar5) - local_38;
      if (iVar3._M_current == piVar1) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar3,&local_40);
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar3._M_current = local_40;
        iVar3._M_current = iVar3._M_current + 1;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current;
      }
      local_40 = (*(int *)((long)(pDVar2->rect).bottomLeft.m_data + lVar5 + 4) +
                 marginRight + marginLeft) -
                 *(int *)((long)(pDVar2->rect).bottomLeft.m_data + lVar5 + -4);
      if (iVar3._M_current == piVar1) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar3,&local_40);
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar3._M_current = local_40;
        iVar3._M_current = iVar3._M_current + 1;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current;
      }
      local_40 = (*(int *)((long)(pDVar2->rect).topRight.m_data + lVar5) + local_3c) -
                 *(int *)((long)(pDVar2->rect).bottomLeft.m_data + lVar5);
      if (iVar3._M_current == piVar1) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar3,&local_40);
      }
      else {
        *iVar3._M_current = local_40;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      pvVar4 = (vector<int,_std::allocator<int>_> *)
               ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
      pDVar2 = (frame->draws).
               super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
               ._M_impl.super__Vector_impl_data._M_start;
      in_RAX = (vector<int,_std::allocator<int>_> *)
               (((long)(frame->draws).
                       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 3) *
               -0x5555555555555555);
      lVar5 = lVar5 + 0x18;
    } while (pvVar4 < in_RAX);
  }
  return in_RAX;
}

Assistant:

vector<EGLint> getDamageRegion (const Frame& frame, int marginLeft, int marginBottom, int marginRight, int marginTop)
{
	vector<EGLint> damageRegion;
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& rect = frame.draws[drawNdx].rect;
		damageRegion.push_back(rect.bottomLeft.x() - marginLeft);
		damageRegion.push_back(rect.bottomLeft.y() - marginBottom);
		damageRegion.push_back(rect.topRight.x() - rect.bottomLeft.x() + marginLeft + marginRight);
		damageRegion.push_back(rect.topRight.y() - rect.bottomLeft.y() + marginBottom + marginTop);
	}

	DE_ASSERT(damageRegion.size() % 4 == 0);
	return damageRegion;
}